

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcp_server_discovery.c
# Opt level: O0

pcp_errno psd_fill_pcp_server_src(pcp_server_t *s)

{
  uint32_t uVar1;
  uint32_t uVar2;
  char *pcVar3;
  in6_addr *__a;
  char *err;
  undefined1 local_28 [4];
  uint32_t src_scope_id;
  in6_addr src_ip;
  pcp_server_t *s_local;
  
  err._4_4_ = 0;
  if (s == (pcp_server_t *)0x0) {
    s_local._4_4_ = PCP_ERR_BAD_ARGS;
  }
  else {
    src_ip.__in6_u._8_8_ = s;
    memset(&s->pcp_server_saddr,0,0x80);
    memset(local_28,0,0x10);
    *(undefined2 *)(src_ip.__in6_u._8_8_ + 0x68) = 10;
    if (*(int *)(src_ip.__in6_u._8_8_ + 8) == 2) {
      s_local._4_4_ = PCP_ERR_BAD_AFINET;
    }
    else {
      pcp_fill_sockaddr((sockaddr *)(src_ip.__in6_u._8_8_ + 0x68),
                        (in6_addr *)(src_ip.__in6_u._8_8_ + 0xc),
                        *(uint16_t *)(src_ip.__in6_u._8_8_ + 0x1c),1,
                        *(uint32_t *)(src_ip.__in6_u._8_8_ + 0x20));
      inet_ntop(10,(void *)(src_ip.__in6_u._8_8_ + 0x70),(char *)(src_ip.__in6_u._8_8_ + 0x34),0x2e)
      ;
      pcVar3 = findsaddr6((sockaddr_in6 *)(src_ip.__in6_u._8_8_ + 0x68),(in6_addr *)local_28,
                          (uint32_t *)((long)&err + 4));
      if (pcVar3 == (char *)0x0) {
        *(undefined1 (*) [4])(src_ip.__in6_u._8_8_ + 0x24) = local_28;
        *(uint32_t *)(src_ip.__in6_u._8_8_ + 0x28) = src_scope_id;
        *(uint32_t *)(src_ip.__in6_u._8_8_ + 0x2c) = src_ip.__in6_u.__u6_addr32[0];
        *(uint32_t *)(src_ip.__in6_u._8_8_ + 0x30) = src_ip.__in6_u.__u6_addr32[1];
        if (*(int *)(src_ip.__in6_u._8_8_ + 0x20) == 0) {
          uVar1 = htonl(0xffc00000);
          uVar2 = htonl(0xfe800000);
          if (((uint)local_28 & uVar1) == uVar2) {
            *(undefined4 *)(src_ip.__in6_u._8_8_ + 0x20) = err._4_4_;
          }
        }
        *(undefined4 *)(src_ip.__in6_u._8_8_ + 0xec) = 2;
        *(undefined8 *)(src_ip.__in6_u._8_8_ + 0x128) = 0;
        *(undefined8 *)(src_ip.__in6_u._8_8_ + 0x130) = 0;
        s_local._4_4_ = PCP_ERR_SUCCESS;
      }
      else {
        pcp_logger(PCP_LOGLVL_WARN,"Error (%s) occurred while registering a new PCP server %s",
                   pcVar3,src_ip.__in6_u._8_8_ + 0x34);
        s_local._4_4_ = PCP_ERR_UNKNOWN;
      }
    }
  }
  return s_local._4_4_;
}

Assistant:

static pcp_errno psd_fill_pcp_server_src(pcp_server_t *s) {
    struct in6_addr src_ip;
    uint32_t src_scope_id = 0;
    const char *err = NULL;

    PCP_LOG_BEGIN(PCP_LOGLVL_DEBUG);

    if (!s) {
        PCP_LOG_END(PCP_LOGLVL_DEBUG);
        return PCP_ERR_BAD_ARGS;
    }

    memset(&s->pcp_server_saddr, 0, sizeof(s->pcp_server_saddr));
    memset(&src_ip, 0, sizeof(src_ip));

#ifndef PCP_USE_IPV6_SOCKET
    s->pcp_server_saddr.ss_family = AF_INET;
    if (s->af == AF_INET) {
        ((struct sockaddr_in *)&s->pcp_server_saddr)->sin_addr.s_addr =
            s->pcp_ip[3];
        ((struct sockaddr_in *)&s->pcp_server_saddr)->sin_port = s->pcp_port;
        SET_SA_LEN(&s->pcp_server_saddr, sizeof(struct sockaddr_in));
        inet_ntop(
            AF_INET,
            (void *)&((struct sockaddr_in *)&s->pcp_server_saddr)->sin_addr,
            s->pcp_server_paddr, sizeof(s->pcp_server_paddr));

        err = findsaddr((struct sockaddr_in *)&s->pcp_server_saddr, &src_ip);
        if (err) {
            PCP_LOG(PCP_LOGLVL_WARN,
                    "Error (%s) occurred while registering a new "
                    "PCP server %s",
                    err, s->pcp_server_paddr);

            PCP_LOG_END(PCP_LOGLVL_DEBUG);
            return PCP_ERR_UNKNOWN;
        }
        s->src_ip[0] = 0;

        s->src_ip[1] = 0;
        s->src_ip[2] = htonl(0xFFFF);
        s->src_ip[3] = S6_ADDR32(&src_ip)[3];
    } else {
        PCP_LOG(PCP_LOGLVL_WARN, "%s",
                "IPv6 is disabled and IPv6 address of PCP server occurred");

        PCP_LOG_END(PCP_LOGLVL_DEBUG);
        return PCP_ERR_BAD_AFINET;
    }
#else  // PCP_USE_IPV6_SOCKET
    s->pcp_server_saddr.ss_family = AF_INET6;
    if (s->af == AF_INET) {
        return PCP_ERR_BAD_AFINET; // should never happen
    }
    pcp_fill_sockaddr((struct sockaddr *)&s->pcp_server_saddr,
                      (struct in6_addr *)&s->pcp_ip, s->pcp_port, 1,
                      s->pcp_scope_id);

    inet_ntop(AF_INET6,
              (void *)&((struct sockaddr_in6 *)&s->pcp_server_saddr)->sin6_addr,
              s->pcp_server_paddr, sizeof(s->pcp_server_paddr));

    err = findsaddr6((struct sockaddr_in6 *)&s->pcp_server_saddr, &src_ip,
                     &src_scope_id);
    if (err) {
        PCP_LOG(PCP_LOGLVL_WARN,
                "Error (%s) occurred while registering a new "
                "PCP server %s",
                err, s->pcp_server_paddr);

        PCP_LOG_END(PCP_LOGLVL_DEBUG);
        return PCP_ERR_UNKNOWN;
    }
    s->src_ip[0] = S6_ADDR32(&src_ip)[0];
    s->src_ip[1] = S6_ADDR32(&src_ip)[1];
    s->src_ip[2] = S6_ADDR32(&src_ip)[2];
    s->src_ip[3] = S6_ADDR32(&src_ip)[3];

    if ((s->pcp_scope_id == 0) && (IN6_IS_ADDR_LINKLOCAL(&src_ip))) {
        s->pcp_scope_id = src_scope_id;
    }
#endif // PCP_USE_IPV6_SOCKET
    s->server_state = pss_ping;
    s->next_timeout.tv_sec = 0;
    s->next_timeout.tv_usec = 0;

    PCP_LOG_END(PCP_LOGLVL_DEBUG);
    return PCP_ERR_SUCCESS;
}